

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<TPZAutoPointer<TPZFMatrix<float>_>_>::TPZVec
          (TPZVec<TPZAutoPointer<TPZFMatrix<float>_>_> *this,int64_t size)

{
  ulong uVar1;
  int64_t *piVar2;
  ulong uVar3;
  long lVar4;
  TPZAutoPointer<TPZFMatrix<float>_> *this_00;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_0165d040;
  this->fStore = (TPZAutoPointer<TPZFMatrix<float>_> *)0x0;
  if (size < 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZVec<TPZAutoPointer<TPZFMatrix<float>>>::TPZVec(const int64_t) [T = TPZAutoPointer<TPZFMatrix<float>>]"
                   );
    std::operator<<((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n");
    std::ostream::flush();
    this->fNElements = 0;
    this->fNAlloc = 0;
  }
  else {
    if (size != 0) {
      uVar1 = size * 8;
      uVar3 = 0xffffffffffffffff;
      if (uVar1 < 0xfffffffffffffff8) {
        uVar3 = uVar1 + 8;
      }
      lVar4 = 0;
      piVar2 = (int64_t *)operator_new__(-(ulong)((ulong)size >> 0x3d != 0) | uVar3);
      *piVar2 = size;
      this_00 = (TPZAutoPointer<TPZFMatrix<float>_> *)(piVar2 + 1);
      do {
        TPZAutoPointer<TPZFMatrix<float>_>::TPZAutoPointer(this_00);
        lVar4 = lVar4 + -8;
        this_00 = this_00 + 1;
      } while (-lVar4 != uVar1);
      this->fStore = (TPZAutoPointer<TPZFMatrix<float>_> *)(piVar2 + 1);
    }
    this->fNElements = size;
    this->fNAlloc = size;
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	// If a positive value was requested, allocate it.
	if( size > 0 )
	{
		fStore = new T[ size ];
	}
	
	// Note that even 0 sized vectors are allowed.
	fNElements = size;
    fNAlloc = size;
    
}